

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> eventSourceId;
  cx_string<2UL> cVar3;
  int iVar4;
  size_t sVar5;
  Session *pSVar6;
  undefined8 uVar7;
  basic_ofstream<char,_std::char_traits<char>_> *out;
  char *__end;
  long *in_FS_OFFSET;
  bool bVar8;
  ofstream logfile;
  cx_string<1UL> local_312;
  undefined1 local_310 [16];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  uint64_t local_2a0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  ConsumeResult local_258;
  undefined1 local_238 [8];
  size_type sStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  byte abStack_218 [216];
  ios_base local_140 [272];
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_238);
    main_cold_1();
  }
  lVar1 = *in_FS_OFFSET;
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_238);
        main_cold_2();
      }
      __mutex = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_310._0_8_ = 0;
      local_310._8_2_ = info;
      local_300._M_p = (pointer)&local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"main","");
      local_2e0._M_p = (pointer)&local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"main","");
      local_2c0._M_p = (pointer)&local_2b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/HelloWorld.cpp"
                 ,"");
      local_2a0 = 0xc;
      local_298._M_p = (pointer)&local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Hello {}!","");
      local_258.bytesConsumed._0_2_ = 0x5b;
      local_312._data[0] = 'c';
      local_312._data[1] = '\0';
      cVar3 = mserialize::cx_strcat<1ul,1ul>((cx_string<1UL> *)&local_258,&local_312);
      local_238 = (undefined1  [8])(CONCAT53(local_238._3_5_,cVar3._data) & 0xffffffffff00ffff);
      local_278._M_p = (pointer)&local_268;
      sVar5 = strlen(local_238);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,local_238,local_238 + sVar5);
      iVar4 = pthread_mutex_lock(__mutex);
      if (iVar4 != 0) {
        uVar7 = std::__throw_system_error(iVar4);
        if (local_238 != (undefined1  [8])&local_228) {
          operator_delete((void *)local_238,local_228._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar7);
      }
      local_310._0_8_ = __mutex[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_310,(RecoverableVectorOutputStream *)((long)__mutex + 0x58));
      _Var2._M_i = __mutex[3].__align;
      __mutex[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(__mutex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_p != &local_288) {
        operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_p != &local_2b0) {
        operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_p != &local_2d0) {
        operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_p != &local_2f0) {
        operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)local_238);
      main_cold_3();
    }
    local_238 = (undefined1  [8])0x0;
    sStack_230 = 0;
    clock_gettime(0,(timespec *)local_238);
    binlog::SessionWriter::addEvent<char_const(&)[6]>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,
               (long)local_238 * 1000000000 + sStack_230,(char (*) [6])"World");
  }
  std::ofstream::ofstream((binlog *)local_238,"hello.blog",_S_out|_S_bin);
  binlog::consume<std::ofstream>(&local_258,(binlog *)local_238,out);
  bVar8 = (abStack_218[*(long *)((long)local_238 + -0x18)] & 5) == 0;
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Binary log written to hello.blog\n",0x21);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to write hello.blog\n",0x1b);
  }
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = _strftime;
  std::filebuf::~filebuf((filebuf *)&sStack_230);
  std::ios_base::~ios_base(local_140);
  return (uint)!bVar8;
}

Assistant:

int main()
{
  BINLOG_INFO("Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  binlog::consume(logfile);
//]

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;

//[hello
}